

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
 __thiscall restincurl::Worker::GetNextTimeout(Worker *this)

{
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar1;
  int local_2c;
  duration<long,_std::ratio<1L,_1L>_> local_28;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  Worker *local_18;
  Worker *this_local;
  
  local_18 = this;
  local_20.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_2c = 0x3c;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_28,&local_2c);
  tVar1 = std::chrono::operator+(&local_20,&local_28);
  return (duration)tVar1.__d.__r;
}

Assistant:

auto GetNextTimeout() const noexcept {
            return std::chrono::steady_clock::now()
                + std::chrono::seconds(RESTINCURL_IDLE_TIMEOUT_SEC);
        }